

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O1

string * __thiscall
LTAircraft::GetFlightId_abi_cxx11_(string *__return_storage_ptr__,LTAircraft *this)

{
  pointer pcVar1;
  string _default;
  FDStaticData stat;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffe40;
  long in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  FDStaticData local_1a8;
  
  LTFlightData::WaitForSafeCopyStat(&local_1a8,this->fd);
  pcVar1 = (this->fd->acKey).key._M_dataplus._M_p;
  puVar2 = &stack0xfffffffffffffe48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe38,pcVar1,
             pcVar1 + (this->fd->acKey).key._M_string_length);
  _default._M_string_length = in_stack_fffffffffffffe40;
  _default._M_dataplus._M_p = puVar2;
  _default.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
  _default.field_2._8_8_ = in_stack_fffffffffffffe50;
  LTFlightData::FDStaticData::acId(__return_storage_ptr__,&local_1a8,_default);
  if (puVar2 != &stack0xfffffffffffffe48) {
    operator_delete(puVar2,in_stack_fffffffffffffe48 + 1);
  }
  LTFlightData::FDStaticData::~FDStaticData(&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::GetFlightId() const
{
    LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    return stat.acId(key());
}